

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O1

void __thiscall Fl_Decl_Type::write_properties(Fl_Decl_Type *this)

{
  char *format;
  
  Fl_Type::write_properties(&this->super_Fl_Type);
  if ((ulong)(byte)this->public_ < 3) {
    write_string(&DAT_0021029c + *(int *)(&DAT_0021029c + (ulong)(byte)this->public_ * 4));
  }
  format = "local";
  if (this->static_ == '\0') {
    format = "global";
  }
  write_string(format);
  return;
}

Assistant:

void Fl_Decl_Type::write_properties() {
  Fl_Type::write_properties();
  switch (public_) {
    case 0: write_string("private"); break;
    case 1: write_string("public"); break;
    case 2: write_string("protected"); break;
  }
  if (static_) 
    write_string("local");
  else
    write_string("global");
}